

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucase.cpp
# Opt level: O3

int32_t ucase_hasBinaryProperty_63(UChar32 c,UProperty which)

{
  byte bVar1;
  int32_t iVar2;
  uint uVar3;
  UBool upperNotTitle;
  bool bVar4;
  UChar *resultString;
  UChar *pUStack_18;
  
  uVar3 = 0;
  if (which < UCHAR_CASE_SENSITIVE) {
    if (which == UCHAR_LOWERCASE) {
      iVar2 = ucase_getType_63(c);
      bVar4 = iVar2 == 1;
    }
    else {
      if (which == UCHAR_SOFT_DOTTED) {
        bVar1 = ucase_isSoftDotted_63(c);
        goto LAB_002ba84f;
      }
      if (which != UCHAR_UPPERCASE) {
        return 0;
      }
      iVar2 = ucase_getType_63(c);
      bVar4 = iVar2 == 2;
    }
    return (uint)bVar4;
  }
  switch(which) {
  case UCHAR_CASED:
    iVar2 = ucase_getType_63(c);
    uVar3 = (uint)(iVar2 != 0);
    break;
  case UCHAR_CASE_IGNORABLE:
    uVar3 = ucase_getTypeOrIgnorable_63(c);
    uVar3 = uVar3 >> 2;
    break;
  case UCHAR_CHANGES_WHEN_LOWERCASED:
    uVar3 = ucase_toFullLower_63(c,(UCaseContextIterator *)0x0,(void *)0x0,&pUStack_18,1);
    goto LAB_002ba8e9;
  case UCHAR_CHANGES_WHEN_UPPERCASED:
    upperNotTitle = '\x01';
    goto LAB_002ba8e4;
  case UCHAR_CHANGES_WHEN_CASEFOLDED:
    break;
  case UCHAR_CHANGES_WHEN_CASEMAPPED:
    iVar2 = ucase_toFullLower_63(c,(UCaseContextIterator *)0x0,(void *)0x0,&pUStack_18,1);
    if (-1 < iVar2) {
      return 1;
    }
    iVar2 = toUpperOrTitle(c,(UCaseContextIterator *)0x0,(void *)0x0,&pUStack_18,1,'\x01');
    if (-1 < iVar2) {
      return 1;
    }
  case UCHAR_CHANGES_WHEN_TITLECASED:
    upperNotTitle = '\0';
LAB_002ba8e4:
    uVar3 = toUpperOrTitle(c,(UCaseContextIterator *)0x0,(void *)0x0,&pUStack_18,1,upperNotTitle);
LAB_002ba8e9:
    uVar3 = ~uVar3 >> 0x1f;
    break;
  default:
    if (which != UCHAR_CASE_SENSITIVE) {
      return 0;
    }
    bVar1 = ucase_isCaseSensitive_63(c);
LAB_002ba84f:
    return (uint)bVar1;
  }
  return uVar3;
}

Assistant:

U_CFUNC int32_t U_EXPORT2
ucase_hasBinaryProperty(UChar32 c, UProperty which) {
    /* case mapping properties */
    const UChar *resultString;
    switch(which) {
    case UCHAR_LOWERCASE:
        return (UBool)(UCASE_LOWER==ucase_getType(c));
    case UCHAR_UPPERCASE:
        return (UBool)(UCASE_UPPER==ucase_getType(c));
    case UCHAR_SOFT_DOTTED:
        return ucase_isSoftDotted(c);
    case UCHAR_CASE_SENSITIVE:
        return ucase_isCaseSensitive(c);
    case UCHAR_CASED:
        return (UBool)(UCASE_NONE!=ucase_getType(c));
    case UCHAR_CASE_IGNORABLE:
        return (UBool)(ucase_getTypeOrIgnorable(c)>>2);
    /*
     * Note: The following Changes_When_Xyz are defined as testing whether
     * the NFD form of the input changes when Xyz-case-mapped.
     * However, this simpler implementation of these properties,
     * ignoring NFD, passes the tests.
     * The implementation needs to be changed if the tests start failing.
     * When that happens, optimizations should be used to work with the
     * per-single-code point ucase_toFullXyz() functions unless
     * the NFD form has more than one code point,
     * and the property starts set needs to be the union of the
     * start sets for normalization and case mappings.
     */
    case UCHAR_CHANGES_WHEN_LOWERCASED:
        return (UBool)(ucase_toFullLower(c, NULL, NULL, &resultString, UCASE_LOC_ROOT)>=0);
    case UCHAR_CHANGES_WHEN_UPPERCASED:
        return (UBool)(ucase_toFullUpper(c, NULL, NULL, &resultString, UCASE_LOC_ROOT)>=0);
    case UCHAR_CHANGES_WHEN_TITLECASED:
        return (UBool)(ucase_toFullTitle(c, NULL, NULL, &resultString, UCASE_LOC_ROOT)>=0);
    /* case UCHAR_CHANGES_WHEN_CASEFOLDED: -- in uprops.c */
    case UCHAR_CHANGES_WHEN_CASEMAPPED:
        return (UBool)(
            ucase_toFullLower(c, NULL, NULL, &resultString, UCASE_LOC_ROOT)>=0 ||
            ucase_toFullUpper(c, NULL, NULL, &resultString, UCASE_LOC_ROOT)>=0 ||
            ucase_toFullTitle(c, NULL, NULL, &resultString, UCASE_LOC_ROOT)>=0);
    default:
        return FALSE;
    }
}